

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcUtils.c
# Opt level: O3

int Mvc_CoverSupportSizeBinary(Mvc_Cover_t *pCover)

{
  uint uVar1;
  Mvc_Cube_t *pSupp;
  byte bVar2;
  uint uVar3;
  uint uVar4;
  
  pSupp = Mvc_CubeAlloc(pCover);
  Mvc_CoverSupportAnd(pCover,pSupp);
  uVar1 = pCover->nBits / 2;
  uVar3 = uVar1;
  if (1 < pCover->nBits) {
    bVar2 = 0;
    uVar4 = 0;
    do {
      uVar3 = uVar3 - ((~pSupp->pData[uVar4 >> 4] >> (bVar2 & 0x1e) & 3) == 0);
      uVar4 = uVar4 + 1;
      bVar2 = bVar2 + 2;
    } while (uVar1 != uVar4);
  }
  Mvc_CubeFree(pCover,pSupp);
  return uVar3;
}

Assistant:

int Mvc_CoverSupportSizeBinary( Mvc_Cover_t * pCover )
{
    Mvc_Cube_t * pSupp;
    int Counter, i, v0, v1;
    // compute the support
    pSupp = Mvc_CubeAlloc( pCover );
    Mvc_CoverSupportAnd( pCover, pSupp );
    Counter = pCover->nBits/2;
    for ( i = 0; i < pCover->nBits/2; i++ )
    {
        v0 = Mvc_CubeBitValue( pSupp, 2*i   );
        v1 = Mvc_CubeBitValue( pSupp, 2*i+1 );
        if ( v0 && v1 )
            Counter--;
    }
    Mvc_CubeFree( pCover, pSupp );
    return Counter;
}